

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepVertex::Read(ON_BrepVertex *this,ON_BinaryArchive *file)

{
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_BrepVertex *this_local;
  
  local_19 = ON_BinaryArchive::ReadInt(file,&this->m_vertex_index);
  if (local_19) {
    local_19 = ON_BinaryArchive::ReadPoint(file,&(this->super_ON_Point).point);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::ReadArray(file,&this->m_ei);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::ReadDouble(file,&this->m_tolerance);
  }
  return local_19;
}

Assistant:

bool
ON_BrepVertex::Read( ON_BinaryArchive& file )
{
  bool rc = file.ReadInt( &m_vertex_index );
  if ( rc )
    rc = file.ReadPoint( point );
  if ( rc )
    rc = file.ReadArray( m_ei );
  if ( rc )
    rc = file.ReadDouble( &m_tolerance );
  return rc;
}